

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DirectMSFStream.cpp
# Opt level: O3

void __thiscall
PDB::DirectMSFStream::ReadAtOffset
          (DirectMSFStream *this,void *destination,size_t size,size_t offset)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  void *__src;
  void *__dest;
  size_t __n;
  ulong __n_00;
  long lVar4;
  
  bVar1 = (byte)this->m_blockSizeLog2;
  uVar3 = offset >> (bVar1 & 0x3f);
  uVar2 = (ulong)((uint)offset & this->m_blockSize - 1);
  __n_00 = this->m_blockSize - uVar2;
  __src = (void *)((long)this->m_data +
                  uVar2 + ((ulong)this->m_blockIndices[uVar3] << (bVar1 & 0x3f)));
  __n = size;
  __dest = destination;
  if (__n_00 < size) {
    memcpy(destination,__src,__n_00);
    __n = size - __n_00;
    if (__n != 0) {
      lVar4 = uVar3 * 4;
      do {
        lVar4 = lVar4 + 4;
        __dest = (void *)((size - __n) + (long)destination);
        __src = (void *)(((ulong)*(uint *)((long)this->m_blockIndices + lVar4) <<
                         ((byte)this->m_blockSizeLog2 & 0x3f)) + (long)this->m_data);
        if (__n <= this->m_blockSize) goto LAB_0010e42a;
        memcpy(__dest,__src,(ulong)this->m_blockSize);
        __n = __n - this->m_blockSize;
      } while (__n != 0);
    }
    return;
  }
LAB_0010e42a:
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

void PDB::DirectMSFStream::ReadAtOffset(void* destination, size_t size, size_t offset) const PDB_NO_EXCEPT
{
	PDB_ASSERT(destination != nullptr, "Destination buffer not set");
	PDB_ASSERT(offset + size <= m_size, "Not enough data left to read.");

	// work out which block and offset within the block the read offset corresponds to
	size_t blockIndex = offset >> m_blockSizeLog2;
	const size_t offsetWithinBlock = offset & (m_blockSize - 1u);

	// work out the offset within the data based on the block indices
	size_t offsetWithinData = (static_cast<size_t>(m_blockIndices[blockIndex]) << m_blockSizeLog2) + offsetWithinBlock;
	const size_t bytesLeftInBlock = m_blockSize - offsetWithinBlock;

	if (bytesLeftInBlock >= size)
	{
		// fast path, all the data can be read in one go
		const void* const sourceData = Pointer::Offset<const void*>(m_data, offsetWithinData);
		std::memcpy(destination, sourceData, size);
	}
	else
	{
		// slower path, data is scattered across several blocks.
		// read remaining bytes in current block first.
		{
			const void* const sourceData = Pointer::Offset<const void*>(m_data, offsetWithinData);
			std::memcpy(destination, sourceData, bytesLeftInBlock);
		}

		// read remaining bytes from blocks
		size_t bytesLeftToRead = size - bytesLeftInBlock;
		while (bytesLeftToRead != 0u)
		{
			// advance to the next block
			++blockIndex;
			offsetWithinData = static_cast<size_t>(m_blockIndices[blockIndex]) << m_blockSizeLog2;

			void* const destinationData = Pointer::Offset<void*>(destination, size - bytesLeftToRead);
			const void* const sourceData = Pointer::Offset<const void*>(m_data, offsetWithinData);

			if (bytesLeftToRead > m_blockSize)
			{
				// copy a whole block at once
				std::memcpy(destinationData, sourceData, m_blockSize);
				bytesLeftToRead -= m_blockSize;
			}
			else
			{
				// copy remaining bytes
				std::memcpy(destinationData, sourceData, bytesLeftToRead);
				bytesLeftToRead -= bytesLeftToRead;
			}
		}
	}
}